

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimulationIslandManager.cpp
# Opt level: O0

void __thiscall
btSimulationIslandManager::storeIslandActivationState
          (btSimulationIslandManager *this,btCollisionWorld *colWorld)

{
  bool bVar1;
  int iVar2;
  btCollisionObjectArray *pbVar3;
  btCollisionObject **ppbVar4;
  btElement *pbVar5;
  btCollisionWorld *in_RSI;
  undefined8 in_RDI;
  btCollisionObject *collisionObject;
  int i;
  int index;
  int iVar6;
  btCollisionObject *this_00;
  btCollisionObject *this_01;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    iVar6 = local_18;
    pbVar3 = btCollisionWorld::getCollisionObjectArray(in_RSI);
    iVar2 = btAlignedObjectArray<btCollisionObject_*>::size(pbVar3);
    if (iVar2 <= iVar6) break;
    pbVar3 = btCollisionWorld::getCollisionObjectArray(in_RSI);
    ppbVar4 = btAlignedObjectArray<btCollisionObject_*>::operator[](pbVar3,local_18);
    this_00 = *ppbVar4;
    bVar1 = btCollisionObject::isStaticOrKinematicObject(this_00);
    if (bVar1) {
      btCollisionObject::setIslandTag(this_00,-1);
      btCollisionObject::setCompanionId(this_00,-2);
    }
    else {
      this_01 = this_00;
      iVar2 = btUnionFind::find((btUnionFind *)this_00,(int)((ulong)in_RDI >> 0x20));
      btCollisionObject::setIslandTag(this_00,iVar2);
      iVar2 = local_18;
      pbVar5 = btUnionFind::getElement
                         ((btUnionFind *)CONCAT44(iVar6,local_18),(int)((ulong)this_00 >> 0x20));
      pbVar5->m_sz = iVar2;
      btCollisionObject::setCompanionId(this_01,-1);
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void   btSimulationIslandManager::storeIslandActivationState(btCollisionWorld* colWorld)
{
	// put the islandId ('find' value) into m_tag   
	{
		int index = 0;
		int i;
		for (i=0;i<colWorld->getCollisionObjectArray().size();i++)
		{
			btCollisionObject* collisionObject= colWorld->getCollisionObjectArray()[i];
			if (!collisionObject->isStaticOrKinematicObject())
			{
				collisionObject->setIslandTag( m_unionFind.find(index) );
				//Set the correct object offset in Collision Object Array
				m_unionFind.getElement(index).m_sz = i;
				collisionObject->setCompanionId(-1);
				index++;
			} else
			{
				collisionObject->setIslandTag(-1);
				collisionObject->setCompanionId(-2);
			}
		}
	}
}